

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

void getLpMatrixCoefficient(HighsLp *lp,HighsInt Xrow,HighsInt Xcol,double *val)

{
  pointer piVar1;
  ulong uVar2;
  double dVar3;
  
  piVar1 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (ulong)piVar1[Xcol];
  dVar3 = 0.0;
  do {
    if ((long)piVar1[(long)Xcol + 1] <= (long)uVar2) {
LAB_0025faa7:
      *val = dVar3;
      return;
    }
    if ((lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2] == Xrow) {
      if (-1 < (long)uVar2) {
        dVar3 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2 & 0xffffffff];
      }
      goto LAB_0025faa7;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void getLpMatrixCoefficient(const HighsLp& lp, const HighsInt Xrow,
                            const HighsInt Xcol, double* val) {
  assert(0 <= Xrow && Xrow < lp.num_row_);
  assert(0 <= Xcol && Xcol < lp.num_col_);

  HighsInt get_el = -1;
  for (HighsInt el = lp.a_matrix_.start_[Xcol];
       el < lp.a_matrix_.start_[Xcol + 1]; el++) {
    if (lp.a_matrix_.index_[el] == Xrow) {
      get_el = el;
      break;
    }
  }
  if (get_el < 0) {
    *val = 0;
  } else {
    *val = lp.a_matrix_.value_[get_el];
  }
}